

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,bool reuse_addr,type_conflict param_4)

{
  implementation_type *impl;
  error_code ec;
  protocol_type protocol;
  error_code local_40;
  boolean<1,_2> local_30;
  int local_2c;
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  local_2c = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  impl = &(this->impl_).implementation_;
  detail::reactive_socket_service<asio::ip::tcp>::open
            ((this->impl_).service_,(char *)impl,(int)&local_2c,&local_40);
  detail::throw_error(&local_40,"open");
  if (reuse_addr) {
    local_30.value_ = 1;
    detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((this->impl_).service_,impl,&local_30,&local_40);
    detail::throw_error(&local_40,"set_option");
  }
  detail::reactive_socket_service<asio::ip::tcp>::bind
            ((this->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)&local_40);
  detail::throw_error(&local_40,"bind");
  detail::reactive_socket_service_base::listen
            (&((this->impl_).service_)->super_reactive_socket_service_base,(int)impl,0x1000);
  detail::throw_error(&local_40,"listen");
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const endpoint_type& endpoint, bool reuse_addr = true,
      typename constraint<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    if (reuse_addr)
    {
      impl_.get_service().set_option(impl_.get_implementation(),
          socket_base::reuse_address(true), ec);
      asio::detail::throw_error(ec, "set_option");
    }
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
    impl_.get_service().listen(impl_.get_implementation(),
        socket_base::max_listen_connections, ec);
    asio::detail::throw_error(ec, "listen");
  }